

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec4 val)

{
  bool bVar1;
  __type _Var2;
  reference pGVar3;
  invalid_argument *piVar4;
  long in_RDI;
  undefined1 in_XMM0 [16];
  undefined1 in_XMM1 [16];
  GLShaderUniform *u;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
  *__range2;
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
  local_30;
  long local_28;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = vmovlpd_avx(in_XMM0);
  local_8 = vmovlpd_avx(in_XMM1);
  local_28 = in_RDI + 0x30;
  local_30._M_current =
       (GLShaderUniform *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
       ::begin(in_stack_ffffffffffffff68);
  std::
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
  ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xffffffffffffff90);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pGVar3 = __gnu_cxx::
             __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
             ::operator*(&local_30);
    _Var2 = std::operator==(in_stack_ffffffffffffff90,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
    ::operator++(&local_30);
  }
  if (pGVar3->type == Vector4Float) {
    pGVar3->isSet = true;
    return;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Tried to set GLShaderUniform with wrong type");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec4 val) {

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == DataType::Vector4Float) {
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}